

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void __thiscall nivalis::Plotter::delete_slider(Plotter *this,size_t idx)

{
  ulong *puVar1;
  size_t *i;
  ulong *puVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar3;
  
  end_slider_animation(this,idx);
  puVar1 = (this->animating_sliders).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (this->animating_sliders).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    if (idx < *puVar2) {
      *puVar2 = *puVar2 - 1;
    }
  }
  pVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::equal_range(&(this->sliders_vars)._M_t,
                        &(this->sliders).
                         super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                         ._M_impl.super__Vector_impl_data._M_start[idx].var_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&(this->sliders_vars)._M_t,(_Base_ptr)pVar3.first._M_node,
                 (_Base_ptr)pVar3.second._M_node);
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::_M_erase
            (&this->sliders,
             (this->sliders).
             super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>._M_impl.
             super__Vector_impl_data._M_start + idx);
  (this->slider_error)._M_string_length = 0;
  *(this->slider_error)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void Plotter::delete_slider(size_t idx) {
    // Remove from slider animation list and correct indices
    end_slider_animation(idx);
    for (size_t& i : animating_sliders) {
        if (i > idx) i--;
    }
    // Erase the slider
    sliders_vars.erase(sliders[idx].var_name);
    sliders.erase(sliders.begin() + idx);
    slider_error.clear();
}